

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O0

void __thiscall
Lib::
Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::Recycled(Recycled<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           *this)

{
  bool bVar1;
  Stack<std::unique_ptr<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>_>
  *this_00;
  Stack<std::unique_ptr<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>_>
  *in_stack_00000008;
  
  this_00 = mem();
  bVar1 = Stack<std::unique_ptr<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>_>
          ::isNonEmpty(this_00);
  if (bVar1) {
    mem();
    Stack<std::unique_ptr<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>,_std::default_delete<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>_>_>_>_>
    ::pop(in_stack_00000008);
  }
  else {
    std::make_unique<Lib::Stack<Lib::BottomUpChildIter<Kernel::AutoDerefTermSpec>>>();
  }
  return;
}

Assistant:

Recycled()
    : _self(mem().isNonEmpty() ? mem().pop() : IF_USE_PTRS(std::make_unique<T>(), T()))
  { }